

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatMem.c
# Opt level: O1

Msat_MmStep_t * Msat_MmStepStart(int nSteps)

{
  int iVar1;
  Msat_MmStep_t *pMVar2;
  Msat_MmFixed_t **ppMVar3;
  Msat_MmFixed_t *pMVar4;
  Msat_MmFixed_t **ppMVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  
  pMVar2 = (Msat_MmStep_t *)malloc(0x20);
  pMVar2->nMems = nSteps;
  ppMVar3 = (Msat_MmFixed_t **)malloc((long)nSteps * 8);
  pMVar2->pMems = ppMVar3;
  if (0 < nSteps) {
    uVar8 = 0;
    do {
      pMVar4 = Msat_MmFixedStart(8 << ((byte)uVar8 & 0x1f));
      ppMVar3[uVar8] = pMVar4;
      uVar8 = uVar8 + 1;
    } while ((uint)nSteps != uVar8);
  }
  iVar1 = 4 << ((byte)nSteps & 0x1f);
  pMVar2->nMapSize = iVar1;
  ppMVar5 = (Msat_MmFixed_t **)malloc((long)(iVar1 + 1) << 3);
  pMVar2->pMap = ppMVar5;
  *ppMVar5 = (Msat_MmFixed_t *)0x0;
  pMVar4 = *ppMVar3;
  lVar6 = 0;
  do {
    ppMVar5[lVar6 + 1] = pMVar4;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  if (0 < nSteps) {
    uVar8 = 0;
    do {
      iVar7 = 4 << ((byte)uVar8 & 0x1f);
      iVar1 = 8 << ((byte)uVar8 & 0x1f);
      if (iVar7 < iVar1) {
        pMVar4 = ppMVar3[uVar8];
        lVar6 = 0;
        do {
          ppMVar5[(long)iVar7 + lVar6 + 1] = pMVar4;
          lVar6 = lVar6 + 1;
        } while (iVar1 - iVar7 != (int)lVar6);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uint)nSteps);
  }
  return pMVar2;
}

Assistant:

Msat_MmStep_t * Msat_MmStepStart( int nSteps )
{
    Msat_MmStep_t * p;
    int i, k;
    p = ABC_ALLOC( Msat_MmStep_t, 1 );
    p->nMems = nSteps;
    // start the fixed memory managers
    p->pMems = ABC_ALLOC( Msat_MmFixed_t *, p->nMems );
    for ( i = 0; i < p->nMems; i++ )
        p->pMems[i] = Msat_MmFixedStart( (8<<i) );
    // set up the mapping of the required memory size into the corresponding manager
    p->nMapSize = (4<<p->nMems);
    p->pMap = ABC_ALLOC( Msat_MmFixed_t *, p->nMapSize+1 );
    p->pMap[0] = NULL;
    for ( k = 1; k <= 4; k++ )
        p->pMap[k] = p->pMems[0];
    for ( i = 0; i < p->nMems; i++ )
        for ( k = (4<<i)+1; k <= (8<<i); k++ )
            p->pMap[k] = p->pMems[i];
//for ( i = 1; i < 100; i ++ )
//printf( "%10d: size = %10d\n", i, p->pMap[i]->nEntrySize );
    return p;
}